

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_kmgmt.c
# Opt level: O0

int ecx_gen_set_params(void *genctx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  char *pcVar3;
  char *in_RDI;
  char *groupname;
  OSSL_PARAM *p;
  ecx_gen_ctx *gctx;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  if (in_RDI == (char *)0x0) {
    return 0;
  }
  pOVar2 = OSSL_PARAM_locate_const
                     ((OSSL_PARAM *)in_stack_ffffffffffffffd0,
                      (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (pOVar2 != (OSSL_PARAM *)0x0) {
    in_stack_ffffffffffffffd0 = (char *)0x0;
    in_stack_ffffffffffffffcc = *(int *)(in_RDI + 0x10);
    if (in_stack_ffffffffffffffcc == 0) {
      in_stack_ffffffffffffffd0 = "x25519";
    }
    else if (in_stack_ffffffffffffffcc == 1) {
      in_stack_ffffffffffffffd0 = "x448";
    }
    if (((pOVar2->data_type != 4) || ((OSSL_PARAM *)in_stack_ffffffffffffffd0 == (OSSL_PARAM *)0x0))
       || (iVar1 = strcasecmp((char *)pOVar2->data,in_stack_ffffffffffffffd0), iVar1 != 0)) {
      iVar1 = (int)((ulong)pOVar2 >> 0x20);
      ERR_new();
      ERR_set_debug(in_RDI,iVar1,in_stack_ffffffffffffffd0);
      ERR_set_error(0x39,0x80106,(char *)0x0);
      return 0;
    }
  }
  pOVar2 = OSSL_PARAM_locate_const
                     ((OSSL_PARAM *)in_stack_ffffffffffffffd0,
                      (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (pOVar2 != (OSSL_PARAM *)0x0) {
    if (pOVar2->data_type != 4) {
      return 0;
    }
    CRYPTO_free(*(void **)(in_RDI + 8));
    pcVar3 = CRYPTO_strdup((char *)pOVar2->data,"providers/implementations/keymgmt/ecx_kmgmt.c",
                           0x22b);
    *(char **)(in_RDI + 8) = pcVar3;
    if (*(long *)(in_RDI + 8) == 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int ecx_gen_set_params(void *genctx, const OSSL_PARAM params[])
{
    struct ecx_gen_ctx *gctx = genctx;
    const OSSL_PARAM *p;

    if (gctx == NULL)
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_GROUP_NAME);
    if (p != NULL) {
        const char *groupname = NULL;

        /*
         * We optionally allow setting a group name - but each algorithm only
         * support one such name, so all we do is verify that it is the one we
         * expected.
         */
        switch (gctx->type) {
            case ECX_KEY_TYPE_X25519:
                groupname = "x25519";
                break;
            case ECX_KEY_TYPE_X448:
                groupname = "x448";
                break;
            default:
                /* We only support this for key exchange at the moment */
                break;
        }
        if (p->data_type != OSSL_PARAM_UTF8_STRING
                || groupname == NULL
                || strcasecmp(p->data, groupname) != 0) {
            ERR_raise(ERR_LIB_PROV, ERR_R_PASSED_INVALID_ARGUMENT);
            return 0;
        }
    }
    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_PROPERTIES);
    if (p != NULL) {
        if (p->data_type != OSSL_PARAM_UTF8_STRING)
            return 0;
        OPENSSL_free(gctx->propq);
        gctx->propq = OPENSSL_strdup(p->data);
        if (gctx->propq == NULL)
            return 0;
    }

    return 1;
}